

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O3

void __thiscall f8n::i18n::Locale::Locale(Locale *this)

{
  connections_list *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *local_98 [2];
  long local_88 [2];
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  IPreferences local_68;
  string local_50 [16];
  long local_40 [2];
  
  (this->LocaleChanged).
  super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_002157e8;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->LocaleChanged).
                      super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->LocaleChanged).
            super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
            .m_connected_slots;
  (this->LocaleChanged).
  super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pcVar1;
  (this->LocaleChanged).
  super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->LocaleChanged).
  super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->LocaleChanged).
  super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal1_00215710;
  (this->locales).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->locales).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->locales).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->selectedLocale)._M_dataplus._M_p = (pointer)&(this->selectedLocale).field_2;
  (this->selectedLocale)._M_string_length = 0;
  (this->selectedLocale).field_2._M_local_buf[0] = '\0';
  (this->localePath)._M_dataplus._M_p = (pointer)&(this->localePath).field_2;
  (this->localePath)._M_string_length = 0;
  (this->localePath).field_2._M_local_buf[0] = '\0';
  (this->localeData).m_type = null;
  (this->localeData).m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->localeData,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->localeData,true);
  (this->defaultLocaleData).m_type = null;
  (this->defaultLocaleData).m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->defaultLocaleData,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->defaultLocaleData,true);
  env::GetDefaultPreferences();
  p_Var3 = p_Stack_70;
  peVar2 = local_78;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
  }
  peVar2 = (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"default","");
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>(local_50,"en_US","");
  (*(peVar2->super_IPreferences)._vptr_IPreferences[0xd])(&local_78,peVar2,local_98,local_50);
  std::__cxx11::string::operator=((string *)&this->selectedLocale,(string *)&local_78);
  if (local_78 != (element_type *)&local_68) {
    operator_delete(local_78,(long)local_68._vptr_IPreferences + 1);
  }
  if ((long *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_,
                    (ulong)((long)(__pthread_internal_list **)local_40[0] + 1));
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  return;
}

Assistant:

Locale::Locale() {
    this->prefs = GetDefaultPreferences();
    this->selectedLocale = prefs->GetString(PREFERENCE_KEY_LOCALE, DEFAULT_LOCALE);
}